

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase615::run(TestCase615 *this)

{
  Builder reader_00;
  Builder reader_01;
  Reader reader_02;
  Reader reader_03;
  undefined1 uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  initializer_list<unsigned_char> expected;
  initializer_list<unsigned_short> expected_00;
  initializer_list<unsigned_char> expected_01;
  initializer_list<unsigned_short> expected_02;
  Fault f_1;
  Reader reader;
  Builder root;
  Builder l;
  MallocMessageBuilder builder;
  uint local_3ac;
  undefined2 local_3a8;
  uint local_3a4;
  StructReader local_3a0;
  StructBuilder local_370;
  ListElementCount local_348;
  StructBuilder local_340;
  Maybe<kj::Exception> local_318;
  ListBuilder local_1b0;
  ListBuilder local_188;
  ListReader local_160;
  ListReader local_130;
  MallocMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_370,&local_100.super_MessageBuilder);
  local_318.ptr.field_1.value.ownFile.content.size_ = (size_t)local_370.data;
  local_318.ptr._0_8_ = local_370.segment;
  local_318.ptr.field_1.value.ownFile.content.ptr = (char *)local_370.capTable;
  PointerBuilder::initStruct(&local_340,(PointerBuilder *)&local_318,(StructSize)0x10000);
  local_3a0.segment = (SegmentReader *)CONCAT26(local_3a0.segment._6_2_,0x380022000c);
  local_370.segment = local_340.segment;
  local_370.capTable = local_340.capTable;
  local_370.data = local_340.pointers;
  PointerBuilder::initList((ListBuilder *)&local_318,(PointerBuilder *)&local_370,TWO_BYTES,3);
  uVar2 = 0;
  lVar4 = 0;
  do {
    *(undefined2 *)(local_318.ptr.field_1.value.ownFile.content.size_ + (uVar2 >> 3)) =
         *(undefined2 *)((long)&local_3a0.segment + lVar4);
    lVar4 = lVar4 + 2;
    uVar2 = uVar2 + (uint)local_318.ptr.field_1._20_4_;
  } while (lVar4 != 6);
  local_318.ptr._0_8_ = local_340.segment;
  local_318.ptr.field_1.value.ownFile.content.ptr = (char *)local_340.capTable;
  local_318.ptr.field_1.value.ownFile.content.size_ = (size_t)local_340.pointers;
  PointerBuilder::getList(&local_188,(PointerBuilder *)&local_318,BYTE,(word *)0x0);
  local_318.ptr._0_3_ = 0x38220c;
  reader_00.builder.capTable = local_188.capTable;
  reader_00.builder.segment = local_188.segment;
  reader_00.builder.ptr = local_188.ptr;
  reader_00.builder.elementCount = local_188.elementCount;
  reader_00.builder.step = local_188.step;
  reader_00.builder.structDataSize = local_188.structDataSize;
  reader_00.builder.structPointerCount = local_188.structPointerCount;
  reader_00.builder.elementSize = local_188.elementSize;
  reader_00.builder._39_1_ = local_188._39_1_;
  expected._M_len = 3;
  expected._M_array = (iterator)&local_318;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_00,expected);
  local_370.segment = local_340.segment;
  local_370.capTable = local_340.capTable;
  local_370.data = local_340.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_318,(PointerBuilder *)&local_370,(StructSize)0x1,(word *)0x0);
  if (local_318.ptr.field_1._16_4_ != 3) {
    local_3a0.segment = (SegmentReader *)CONCAT44(local_3a0.segment._4_4_,3);
    local_3ac = local_318.ptr.field_1._16_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_370,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x271,FAILED,"(3u) == (l.size())","3u, l.size()",(uint *)&local_3a0,&local_3ac);
    kj::_::Debug::Fault::fatal((Fault *)&local_370);
  }
  ListBuilder::getStructElement(&local_370,(ListBuilder *)&local_318,0);
  if (((char)((WireValue<uint32_t> *)local_370.data)->value != '\f') &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3a0.segment = (SegmentReader *)CONCAT44(local_3a0.segment._4_4_,0xc);
    ListBuilder::getStructElement(&local_370,(ListBuilder *)&local_318,0);
    local_3ac = CONCAT31(local_3ac._1_3_,(char)((WireValue<uint32_t> *)local_370.data)->value);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x272,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
               (char (*) [40])"failed: expected (12u) == (l[0].getF())",(uint *)&local_3a0,
               (uchar *)&local_3ac);
  }
  ListBuilder::getStructElement(&local_370,(ListBuilder *)&local_318,1);
  if (((char)((WireValue<uint32_t> *)local_370.data)->value != '\"') &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3a0.segment = (SegmentReader *)CONCAT44(local_3a0.segment._4_4_,0x22);
    ListBuilder::getStructElement(&local_370,(ListBuilder *)&local_318,1);
    local_3ac = CONCAT31(local_3ac._1_3_,(char)((WireValue<uint32_t> *)local_370.data)->value);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x273,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
               (char (*) [40])"failed: expected (34u) == (l[1].getF())",(uint *)&local_3a0,
               (uchar *)&local_3ac);
  }
  ListBuilder::getStructElement(&local_370,(ListBuilder *)&local_318,2);
  if (((char)((WireValue<uint32_t> *)local_370.data)->value != '8') &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3a0.segment = (SegmentReader *)CONCAT44(local_3a0.segment._4_4_,0x38);
    ListBuilder::getStructElement(&local_370,(ListBuilder *)&local_318,2);
    local_3ac = CONCAT31(local_3ac._1_3_,(char)((WireValue<uint32_t> *)local_370.data)->value);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x274,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
               (char (*) [40])"failed: expected (56u) == (l[2].getF())",(uint *)&local_3a0,
               (uchar *)&local_3ac);
  }
  local_318.ptr._0_8_ = local_340.segment;
  local_318.ptr.field_1.value.ownFile.content.ptr = (char *)local_340.capTable;
  local_318.ptr.field_1.value.ownFile.content.size_ = (size_t)local_340.pointers;
  PointerBuilder::getList(&local_1b0,(PointerBuilder *)&local_318,TWO_BYTES,(word *)0x0);
  local_318.ptr._0_6_ = 0x380022000c;
  reader_01.builder.capTable = local_1b0.capTable;
  reader_01.builder.segment = local_1b0.segment;
  reader_01.builder.ptr = local_1b0.ptr;
  reader_01.builder.elementCount = local_1b0.elementCount;
  reader_01.builder.step = local_1b0.step;
  reader_01.builder.structDataSize = local_1b0.structDataSize;
  reader_01.builder.structPointerCount = local_1b0.structPointerCount;
  reader_01.builder.elementSize = local_1b0.elementSize;
  reader_01.builder._39_1_ = local_1b0._39_1_;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&local_318;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_01,expected_00);
  StructBuilder::asReader(&local_340);
  local_318.ptr.field_1.value.ownFile.content.ptr = (char *)local_370.capTable;
  local_318.ptr.field_1.value.ownFile.content.size_ = (size_t)local_370.pointers;
  local_318.ptr._0_8_ = local_370.segment;
  local_318.ptr.field_1._16_4_ = local_348;
  if (local_370.pointerCount == 0) {
    local_318.ptr.field_1.value.ownFile.content.ptr = (char *)(CapTableReader *)0x0;
    local_318.ptr.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
    local_318.ptr._0_8_ = (SegmentBuilder *)0x0;
    local_318.ptr.field_1._16_4_ = 0x7fffffff;
  }
  PointerReader::getList(&local_130,(PointerReader *)&local_318,BYTE,(word *)0x0);
  local_318.ptr._0_3_ = 0x38220c;
  reader_02.reader.capTable = local_130.capTable;
  reader_02.reader.segment = local_130.segment;
  reader_02.reader.ptr = local_130.ptr;
  reader_02.reader.elementCount = local_130.elementCount;
  reader_02.reader.step = local_130.step;
  reader_02.reader.structDataSize = local_130.structDataSize;
  reader_02.reader.structPointerCount = local_130.structPointerCount;
  reader_02.reader.elementSize = local_130.elementSize;
  reader_02.reader._39_1_ = local_130._39_1_;
  reader_02.reader.nestingLimit = local_130.nestingLimit;
  reader_02.reader._44_4_ = local_130._44_4_;
  expected_01._M_len = 3;
  expected_01._M_array = (iterator)&local_318;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_02,expected_01);
  local_3a0.capTable = &(local_370.capTable)->super_CapTableReader;
  local_3a0.data = local_370.pointers;
  local_3a0.segment = &(local_370.segment)->super_SegmentReader;
  local_3a0.pointers._0_4_ = local_348;
  if (local_370.pointerCount == 0) {
    local_3a0.capTable = (CapTableReader *)0x0;
    local_3a0.data = (WirePointer *)0x0;
    local_3a0.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
    local_3a0.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&local_318,(PointerReader *)&local_3a0,INLINE_COMPOSITE,(word *)0x0);
  if (local_318.ptr.field_1._16_4_ != 3) {
    local_3ac = 3;
    local_3a4 = local_318.ptr.field_1._16_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_3a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x27f,FAILED,"(3u) == (l.size())","3u, l.size()",&local_3ac,&local_3a4);
    kj::_::Debug::Fault::fatal((Fault *)&local_3a0);
  }
  ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,0);
  bVar5 = true;
  if (7 < local_3a0.dataSize) {
    bVar5 = (char)((WireValue<uint32_t> *)local_3a0.data)->value != '\f';
  }
  if ((bVar5) && (kj::_::Debug::minSeverity < 3)) {
    local_3ac = 0xc;
    ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,0);
    if (local_3a0.dataSize < 8) {
      uVar1 = 0;
    }
    else {
      uVar1 = (undefined1)((WireValue<uint32_t> *)local_3a0.data)->value;
    }
    local_3a4 = CONCAT31(local_3a4._1_3_,uVar1);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x280,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
               (char (*) [40])"failed: expected (12u) == (l[0].getF())",&local_3ac,
               (uchar *)&local_3a4);
  }
  ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,1);
  bVar5 = true;
  if (7 < local_3a0.dataSize) {
    bVar5 = (char)((WireValue<uint32_t> *)local_3a0.data)->value != '\"';
  }
  if ((bVar5) && (kj::_::Debug::minSeverity < 3)) {
    local_3ac = 0x22;
    ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,1);
    if (local_3a0.dataSize < 8) {
      uVar1 = 0;
    }
    else {
      uVar1 = (undefined1)((WireValue<uint32_t> *)local_3a0.data)->value;
    }
    local_3a4 = CONCAT31(local_3a4._1_3_,uVar1);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x281,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
               (char (*) [40])"failed: expected (34u) == (l[1].getF())",&local_3ac,
               (uchar *)&local_3a4);
  }
  ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,2);
  bVar5 = true;
  if (7 < local_3a0.dataSize) {
    bVar5 = (char)((WireValue<uint32_t> *)local_3a0.data)->value != '8';
  }
  if ((bVar5) && (kj::_::Debug::minSeverity < 3)) {
    local_3ac = 0x38;
    ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,2);
    if (local_3a0.dataSize < 8) {
      uVar1 = 0;
    }
    else {
      uVar1 = (undefined1)((WireValue<uint32_t> *)local_3a0.data)->value;
    }
    local_3a4 = CONCAT31(local_3a4._1_3_,uVar1);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x282,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
               (char (*) [40])"failed: expected (56u) == (l[2].getF())",&local_3ac,
               (uchar *)&local_3a4);
  }
  local_3ac = 0x22000c;
  local_3a8 = 0x38;
  local_3a0.segment = &(local_340.segment)->super_SegmentReader;
  local_3a0.capTable = &(local_340.capTable)->super_CapTableReader;
  local_3a0.data = local_340.pointers;
  PointerBuilder::initList((ListBuilder *)&local_318,(PointerBuilder *)&local_3a0,TWO_BYTES,3);
  uVar2 = 0;
  lVar4 = 0;
  do {
    *(undefined2 *)(local_318.ptr.field_1.value.ownFile.content.size_ + (uVar2 >> 3)) =
         *(undefined2 *)((long)&local_3ac + lVar4);
    lVar4 = lVar4 + 2;
    uVar2 = uVar2 + (uint)local_318.ptr.field_1._20_4_;
  } while (lVar4 != 6);
  local_3a0.segment = (SegmentReader *)&PTR_run_00372590;
  local_3a0.capTable = (CapTableReader *)&local_370;
  kj::_::runCatchingExceptions(&local_318,(Runnable *)&local_3a0);
  if ((local_318.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x28f,ERROR,
               "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
               (char (*) [30])"failed: expected e != nullptr",
               (char (*) [33])"Should have thrown an exception.");
  }
  if (local_318.ptr.isSet == true) {
    kj::Exception::~Exception(&local_318.ptr.field_1.value);
  }
  local_3a0.capTable = &(local_370.capTable)->super_CapTableReader;
  local_3a0.data = local_370.pointers;
  local_3a0.segment = &(local_370.segment)->super_SegmentReader;
  local_3a0.pointers._0_4_ = local_348;
  if (local_370.pointerCount == 0) {
    local_3a0.capTable = (CapTableReader *)0x0;
    local_3a0.data = (WirePointer *)0x0;
    local_3a0.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
    local_3a0.pointers._0_4_ = 0x7fffffff;
  }
  PointerReader::getList
            ((ListReader *)&local_318,(PointerReader *)&local_3a0,INLINE_COMPOSITE,(word *)0x0);
  if (local_318.ptr.field_1._16_4_ != 3) {
    local_3ac = 3;
    local_3a4 = local_318.ptr.field_1._16_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_3a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x294,FAILED,"(3u) == (l.size())","3u, l.size()",&local_3ac,&local_3a4);
    kj::_::Debug::Fault::fatal((Fault *)&local_3a0);
  }
  ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,0);
  if (local_3a0.dataSize < 0x20) {
    bVar5 = false;
  }
  else {
    bVar5 = ((WireValue<uint32_t> *)local_3a0.data)->value != 0;
  }
  if ((bVar5) && (kj::_::Debug::minSeverity < 3)) {
    local_3ac = 0;
    uVar3 = 0;
    ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,0);
    if (0x1f < local_3a0.dataSize) {
      uVar3 = ((WireValue<uint32_t> *)local_3a0.data)->value;
    }
    local_3a4 = uVar3;
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x297,ERROR,"\"failed: expected \" \"(0u) == (l[0].getF())\", 0u, l[0].getF()",
               (char (*) [39])"failed: expected (0u) == (l[0].getF())",&local_3ac,&local_3a4);
  }
  ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,1);
  if (local_3a0.dataSize < 0x20) {
    bVar5 = false;
  }
  else {
    bVar5 = ((WireValue<uint32_t> *)local_3a0.data)->value != 0;
  }
  if ((bVar5) && (kj::_::Debug::minSeverity < 3)) {
    local_3ac = 0;
    ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,1);
    local_3a4 = 0;
    if (0x1f < local_3a0.dataSize) {
      local_3a4 = ((WireValue<uint32_t> *)local_3a0.data)->value;
    }
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x298,ERROR,"\"failed: expected \" \"(0u) == (l[1].getF())\", 0u, l[1].getF()",
               (char (*) [39])"failed: expected (0u) == (l[1].getF())",&local_3ac,&local_3a4);
  }
  ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,2);
  if (local_3a0.dataSize < 0x20) {
    bVar5 = false;
  }
  else {
    bVar5 = ((WireValue<uint32_t> *)local_3a0.data)->value != 0;
  }
  if ((bVar5) && (kj::_::Debug::minSeverity < 3)) {
    local_3ac = 0;
    ListReader::getStructElement(&local_3a0,(ListReader *)&local_318,2);
    local_3a4 = 0;
    if (0x1f < local_3a0.dataSize) {
      local_3a4 = ((WireValue<uint32_t> *)local_3a0.data)->value;
    }
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x299,ERROR,"\"failed: expected \" \"(0u) == (l[2].getF())\", 0u, l[2].getF()",
               (char (*) [39])"failed: expected (0u) == (l[2].getF())",&local_3ac,&local_3a4);
  }
  local_318.ptr.field_1.value.ownFile.content.ptr = (char *)local_370.capTable;
  local_318.ptr._0_8_ = local_370.segment;
  if (local_370.pointerCount == 0) {
    local_348 = 0x7fffffff;
    local_370.pointers = (WirePointer *)0x0;
    local_318.ptr.field_1.value.ownFile.content.ptr = (char *)(CapTableReader *)0x0;
    local_318.ptr._0_8_ = (SegmentBuilder *)0x0;
  }
  local_318.ptr.field_1.value.ownFile.content.size_ = (size_t)local_370.pointers;
  local_318.ptr.field_1._16_4_ = local_348;
  PointerReader::getList(&local_160,(PointerReader *)&local_318,TWO_BYTES,(word *)0x0);
  local_318.ptr._0_6_ = 0x380022000c;
  reader_03.reader.capTable = local_160.capTable;
  reader_03.reader.segment = local_160.segment;
  reader_03.reader.ptr = local_160.ptr;
  reader_03.reader.elementCount = local_160.elementCount;
  reader_03.reader.step = local_160.step;
  reader_03.reader.structDataSize = local_160.structDataSize;
  reader_03.reader.structPointerCount = local_160.structPointerCount;
  reader_03.reader.elementSize = local_160.elementSize;
  reader_03.reader._39_1_ = local_160._39_1_;
  reader_03.reader.nestingLimit = local_160.nestingLimit;
  reader_03.reader._44_4_ = local_160._44_4_;
  expected_02._M_len = 3;
  expected_02._M_array = (iterator)&local_318;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_03,expected_02);
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Encoding, ListUpgrade) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint16_t>>({12, 34, 56});

  checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {12, 34, 56});

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct8>>();
    ASSERT_EQ(3u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
  }

  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {12, 34, 56});

  auto reader = root.asReader();

  checkList(reader.getAnyPointerField().getAs<List<uint8_t>>(), {12, 34, 56});

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct8>>();
    ASSERT_EQ(3u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
  }

  root.getAnyPointerField().setAs<List<uint16_t>>({12, 34, 56});

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      reader.getAnyPointerField().getAs<List<uint32_t>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct32>>();
    ASSERT_EQ(3u, l.size());

    // These should return default values because the structs aren't big enough.
    EXPECT_EQ(0u, l[0].getF());
    EXPECT_EQ(0u, l[1].getF());
    EXPECT_EQ(0u, l[2].getF());
  }

  checkList(reader.getAnyPointerField().getAs<List<uint16_t>>(), {12, 34, 56});
}